

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_data.hpp
# Opt level: O1

MultiFileColumnDefinition *
duckdb::MultiFileColumnDefinition::CreateFromNameAndType
          (MultiFileColumnDefinition *__return_storage_ptr__,string *name,LogicalType *type)

{
  pointer ppVar1;
  child_list_t<LogicalType> *pcVar2;
  pointer name_00;
  MultiFileColumnDefinition local_c8;
  
  MultiFileColumnDefinition(__return_storage_ptr__,name,type);
  if (type->id_ == STRUCT) {
    pcVar2 = StructType::GetChildTypes_abi_cxx11_(type);
    name_00 = (pcVar2->
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              ).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar1 = (pcVar2->
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             ).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (name_00 != ppVar1) {
      do {
        CreateFromNameAndType(&local_c8,&name_00->first,&name_00->second);
        ::std::
        vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
        ::emplace_back<duckdb::MultiFileColumnDefinition>
                  (&(__return_storage_ptr__->children).
                    super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                   ,&local_c8);
        Value::~Value(&local_c8.identifier);
        if (local_c8.default_expression.
            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
            (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
             )0x0) {
          (*((BaseExpression *)
            local_c8.default_expression.
            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl)->
            _vptr_BaseExpression[1])();
        }
        local_c8.default_expression.
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
             (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
              )0x0;
        ::std::
        vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
        ::~vector(&local_c8.children.
                   super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                 );
        LogicalType::~LogicalType(&local_c8.type);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8.name._M_dataplus._M_p != &local_c8.name.field_2) {
          operator_delete(local_c8.name._M_dataplus._M_p);
        }
        name_00 = name_00 + 1;
      } while (name_00 != ppVar1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static MultiFileColumnDefinition CreateFromNameAndType(const string &name, const LogicalType &type) {
		MultiFileColumnDefinition result(name, type);
		if (type.id() == LogicalTypeId::STRUCT) {
			// recursively create for children
			for (auto &child_entry : StructType::GetChildTypes(type)) {
				result.children.push_back(CreateFromNameAndType(child_entry.first, child_entry.second));
			}
		}
		return result;
	}